

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::Directory::ComputeRelativePathTopSource(Directory *this)

{
  bool bVar1;
  char *pcVar2;
  PointerType pBVar3;
  Snapshot *this_00;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> snapshots;
  Snapshot snapshot;
  string result;
  string currentSource;
  allocator local_d9;
  _Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> local_d8;
  value_type local_b8;
  string local_98;
  Directory local_78;
  string local_50;
  
  local_b8.Position.Position = (this->Snapshot_).Position.Position;
  local_b8.State = (this->Snapshot_).State;
  local_b8.Position.Tree = (this->Snapshot_).Position.Tree;
  local_d8._M_impl.super__Vector_impl_data._M_start = (Snapshot *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (Snapshot *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
            ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)&local_d8,&local_b8);
  while( true ) {
    Snapshot::GetBuildsystemDirectoryParent((Snapshot *)&local_78,&local_b8);
    local_b8.Position.Position = (PositionType)local_78.Snapshot_.State;
    local_b8.State = (cmState *)local_78.DirectoryState.Tree;
    local_b8.Position.Tree =
         (cmLinkedTree<cmState::SnapshotDataType> *)local_78.DirectoryState.Position;
    bVar1 = Snapshot::IsValid(&local_b8);
    if (!bVar1) break;
    std::vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::push_back
              ((vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> *)&local_d8,&local_b8)
    ;
  }
  Snapshot::GetDirectory(&local_78,local_d8._M_impl.super__Vector_impl_data._M_start);
  pcVar2 = GetCurrentSource(&local_78);
  std::__cxx11::string::string((string *)&local_98,pcVar2,(allocator *)&local_50);
  this_00 = local_d8._M_impl.super__Vector_impl_data._M_start;
  while (this_00 = this_00 + 1, this_00 != local_d8._M_impl.super__Vector_impl_data._M_finish) {
    Snapshot::GetDirectory(&local_78,this_00);
    pcVar2 = GetCurrentSource(&local_78);
    std::__cxx11::string::string((string *)&local_50,pcVar2,&local_d9);
    bVar1 = cmsys::SystemTools::IsSubDirectory(&local_98,&local_50);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&local_98);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  std::__cxx11::string::_M_assign((string *)&pBVar3->RelativePathTopSource);
  std::__cxx11::string::~string((string *)&local_98);
  std::_Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>::~_Vector_base(&local_d8)
  ;
  return;
}

Assistant:

void cmState::Directory::ComputeRelativePathTopSource()
{
  // Relative path conversion inside the source tree is not used to
  // construct relative paths passed to build tools so it is safe to use
  // even when the source is a network path.

  cmState::Snapshot snapshot = this->Snapshot_;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result = snapshots.front().GetDirectory().GetCurrentSource();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentSource = it->GetDirectory().GetCurrentSource();
    if(cmSystemTools::IsSubDirectory(result, currentSource))
      {
      result = currentSource;
      }
    }
  this->DirectoryState->RelativePathTopSource = result;
}